

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O3

optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu
          (optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *__return_storage_ptr__,
          dwarf_resolver *this,Dwarf_Addr pc)

{
  Dwarf_Half DVar1;
  pointer pcVar2;
  pointer pcVar3;
  Dwarf_Debug pDVar4;
  pointer pcVar5;
  int iVar6;
  cache_mode cVar7;
  char *signature;
  char *expression;
  pointer pcVar8;
  assert_type type;
  ulong uVar9;
  ulong uVar10;
  detail *this_00;
  anon_class_16_2_95585728 callback;
  anon_class_16_2_95585728 callback_00;
  source_location location;
  Dwarf_Half dwversion;
  Dwarf_Half offset_size;
  Dwarf_Error error;
  die_object cu_die;
  Dwarf_Die raw_die;
  Dwarf_Off cu_die_offset;
  Dwarf_Arange arange;
  char *in_stack_ffffffffffffff68;
  Dwarf_Half local_8c [2];
  _Any_data local_88;
  code *local_78;
  code *local_70;
  undefined1 local_68;
  Dwarf_Half local_60;
  die_object local_58;
  Dwarf_Die local_48;
  Dwarf_Off local_40;
  Dwarf_Arange local_38;
  
  if ((this->aranges != (Dwarf_Arange *)0x0) && ((this->skeleton).holds_value == false)) {
    local_88._M_unused._M_object = (Dwarf_Error)0x0;
    iVar6 = dwarf_get_arange(this->aranges,this->arange_count,pc,&local_38,(Dwarf_Error *)&local_88)
    ;
    if (iVar6 == 1) {
LAB_0017e606:
      handle_dwarf_error(this->dbg,(Dwarf_Error)local_88._M_unused._0_8_);
    }
    if (iVar6 == 0) {
      local_88._M_unused._M_object = (Dwarf_Error)0x0;
      iVar6 = dwarf_get_cu_die_offset(local_38,&local_40,(Dwarf_Error *)&local_88);
      if (iVar6 != 1) {
        if (iVar6 == 0) {
          local_88._M_unused._M_object = (Dwarf_Error)0x0;
          iVar6 = dwarf_offdie_b(this->dbg,local_40,1,&local_48,(Dwarf_Error *)&local_88);
          if (iVar6 == 1) goto LAB_0017e606;
          if (iVar6 == 0) {
            pDVar4 = this->dbg;
            local_58.die = local_48;
            if (pDVar4 != (Dwarf_Debug)0x0) {
              local_8c[1] = 0;
              local_8c[0] = 0;
              local_58.dbg = pDVar4;
              iVar6 = dwarf_get_version_of_die(local_48,local_8c,local_8c + 1);
              if (iVar6 == 0) {
                local_78 = (code *)CONCAT71(local_78._1_7_,1);
                local_58.dbg = (Dwarf_Debug)0x0;
                local_58.die = (Dwarf_Die)0x0;
                local_60 = local_8c[0];
                __return_storage_ptr__->holds_value = true;
                *(undefined1 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 1;
                *(Dwarf_Debug *)&__return_storage_ptr__->field_0 = pDVar4;
                *(Dwarf_Die *)((long)&__return_storage_ptr__->field_0 + 8) = local_48;
                local_88._M_unused._M_object = (void *)0x0;
                local_88._8_8_ = 0;
                *(undefined1 *)((long)&__return_storage_ptr__->field_0 + 0x20) = 0;
                (__return_storage_ptr__->field_0).uvalue.dwversion = local_8c[0];
                local_68 = 0;
                die_object::~die_object((die_object *)&local_88);
                die_object::~die_object(&local_58);
                return __return_storage_ptr__;
              }
              assert_fail((detail *)0x1,0x1d1d1c,
                          "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,(source_location)ZEXT816(0x35c),in_stack_ffffffffffffff68);
            }
            type = 0x1d1d6a;
            expression = 
            "cpptrace::detail::libdwarf::die_object::die_object(Dwarf_Debug, Dwarf_Die)";
            signature = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
            ;
            this_00 = (detail *)0x0;
            uVar9 = 0x42;
            local_58.dbg = (Dwarf_Debug)0x0;
          }
          else {
            type = 0x1d1cd6;
            expression = 
            "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)";
            signature = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
            ;
            this_00 = (detail *)0x1;
            uVar9 = 0x358;
          }
        }
        else {
          type = 0x1d1c3f;
          expression = 
          "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)";
          signature = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
          ;
          this_00 = (detail *)0x1;
          uVar9 = 0x355;
        }
        location._8_8_ = 0;
        location.file = (char *)uVar9;
        assert_fail(this_00,type,expression,signature,location,in_stack_ffffffffffffff68);
      }
      goto LAB_0017e606;
    }
  }
  cVar7 = get_cache_mode();
  if (cVar7 == prioritize_memory) {
    __return_storage_ptr__->holds_value = false;
    local_88._8_8_ = 0;
    local_88._M_unused._M_object = operator_new(0x18);
    *(dwarf_resolver **)local_88._M_unused._0_8_ = this;
    *(Dwarf_Addr *)((long)local_88._M_unused._0_8_ + 8) = pc;
    *(optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> **)
     ((long)local_88._M_unused._0_8_ + 0x10) = __return_storage_ptr__;
    local_70 = std::
               _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:875:40)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:875:40)>
               ::_M_manager;
    walk_compilation_units
              (this,(function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)&local_88);
    if (local_78 == (code *)0x0) {
      return __return_storage_ptr__;
    }
    (*local_78)(&local_88,&local_88,__destroy_functor);
    return __return_storage_ptr__;
  }
  lazy_generate_cu_cache(this);
  pcVar2 = (this->cu_cache).
           super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (this->cu_cache).
           super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)pcVar3 - (long)pcVar2;
  if (0 < (long)uVar9) {
    uVar9 = (uVar9 >> 3) * -0x3333333333333333;
    pcVar8 = pcVar2;
    do {
      uVar10 = uVar9 >> 1;
      uVar9 = ~uVar10 + uVar9;
      pcVar5 = pcVar8 + uVar10 + 1;
      if (pc < (pcVar8 + uVar10 + 1)[-1].low) {
        uVar9 = uVar10;
        pcVar5 = pcVar8;
      }
      pcVar8 = pcVar5;
    } while (0 < (long)uVar9);
    pcVar5 = pcVar8 + -1;
    if (pcVar5 == pcVar3 || pcVar8 == pcVar2) goto LAB_0017e49a;
    if ((this->skeleton).holds_value == true) {
      local_88._M_unused._M_member_pointer =
           local_88._M_unused._M_member_pointer & 0xffffffffffffff00;
      callback.pc = pc;
      callback.found = (bool *)&local_88;
      die_object::
      dwarf_ranges<cpptrace::detail::libdwarf::die_object::pc_in_die(cpptrace::detail::libdwarf::die_object_const&,int,unsigned_long_long)const::_lambda(unsigned_long_long,unsigned_long_long)_1_>
                ((die_object *)&this->skeleton,(die_object *)&this->skeleton,
                 (uint)(this->skeleton).field_0.uvalue.dwversion,callback);
      if (local_88._M_pod_data[0] != '\0') goto LAB_0017e47d;
    }
    local_88._M_unused._M_member_pointer = local_88._M_unused._M_member_pointer & 0xffffffffffffff00
    ;
    callback_00.pc = pc;
    callback_00.found = (bool *)&local_88;
    die_object::
    dwarf_ranges<cpptrace::detail::libdwarf::die_object::pc_in_die(cpptrace::detail::libdwarf::die_object_const&,int,unsigned_long_long)const::_lambda(unsigned_long_long,unsigned_long_long)_1_>
              (&pcVar5->die,&pcVar5->die,(uint)pcVar8[-1].dwversion,callback_00);
    if (local_88._M_pod_data[0] != '\0') {
LAB_0017e47d:
      DVar1 = pcVar8[-1].dwversion;
      __return_storage_ptr__->holds_value = true;
      *(undefined1 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
      *(undefined1 *)((long)&__return_storage_ptr__->field_0 + 0x20) = 1;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x18) = pcVar5;
      (__return_storage_ptr__->field_0).uvalue.dwversion = DVar1;
      return __return_storage_ptr__;
    }
  }
LAB_0017e49a:
  __return_storage_ptr__->holds_value = false;
  return __return_storage_ptr__;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        optional<cu_info> lookup_cu(Dwarf_Addr pc) {
            // Check for .debug_aranges for fast lookup
            if(aranges && !skeleton) { // don't bother under split dwarf
                // Try to find pc in aranges
                Dwarf_Arange arange;
                if(wrap(dwarf_get_arange, aranges, arange_count, pc, &arange) == DW_DLV_OK) {
                    // Address in table, load CU die
                    Dwarf_Off cu_die_offset;
                    VERIFY(wrap(dwarf_get_cu_die_offset, arange, &cu_die_offset) == DW_DLV_OK);
                    Dwarf_Die raw_die;
                    // Setting is_info = true for now, assuming in .debug_info rather than .debug_types
                    VERIFY(wrap(dwarf_offdie_b, dbg, cu_die_offset, true, &raw_die) == DW_DLV_OK);
                    die_object cu_die(dbg, raw_die);
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    VERIFY(dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size) == DW_DLV_OK);
                    if(trace_dwarf) {
                        std::fprintf(stderr, "Found CU in aranges\n");
                        cu_die.print();
                    }
                    return cu_info{maybe_owned_die_object::owned(std::move(cu_die)), dwversion};
                }
            }
            // otherwise, or if not in aranges
            // one reason to fallback here is if the compilation has dwarf generated from different compilers and only
            // some of them generate aranges (e.g. static linking with cpptrace after specifying clang++ as the c++
            // compiler while the C compiler defaults to an older gcc)
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                // walk for the cu and go from there
                optional<cu_info> info;
                walk_compilation_units([this, pc, &info] (const die_object& cu_die) {
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                    //auto p = cu_die.get_pc_range(dwversion);
                    //cu_die.print();
                    //fprintf(stderr, "        %llx, %llx\n", p.first, p.second);
                    if(trace_dwarf) {
                        std::fprintf(stderr, "CU: %d %s\n", dwversion, cu_die.get_name().c_str());
                    }
                    // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                    if(
                        (
                            skeleton
                            && skeleton.unwrap().cu_die.pc_in_die(
                                skeleton.unwrap().cu_die,
                                skeleton.unwrap().dwversion,
                                pc
                            )
                        ) || cu_die.pc_in_die(cu_die, dwversion, pc)
                    ) {
                        if(trace_dwarf) {
                            std::fprintf(
                                stderr,
                                "pc in die %08llx %s (now searching for %08llx)\n",
                                to_ull(cu_die.get_global_offset()),
                                cu_die.get_tag_name(),
                                to_ull(pc)
                            );
                        }
                        info = cu_info{maybe_owned_die_object::owned(cu_die.clone()), dwversion};
                        return false;
                    }
                    return true;
                });
                return info;
            } else {
                lazy_generate_cu_cache();
                // look up the cu
                auto vec_it = first_less_than_or_equal(
                    cu_cache.begin(),
                    cu_cache.end(),
                    pc,
                    [] (Dwarf_Addr pc, const cu_entry& entry) {
                        return pc < entry.low;
                    }
                );
                // TODO: Vec-it is already range-based, this range check is redundant
                // If the vector has been empty this can happen
                if(vec_it != cu_cache.end()) {
                    // TODO: Cache the range list?
                    // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                    if(
                        (
                            skeleton
                            && skeleton.unwrap().cu_die.pc_in_die(
                                skeleton.unwrap().cu_die,
                                skeleton.unwrap().dwversion,
                                pc
                            )
                        ) || vec_it->die.pc_in_die(vec_it->die, vec_it->dwversion, pc)
                    ) {
                        return cu_info{maybe_owned_die_object::ref(vec_it->die), vec_it->dwversion};
                    }
                } else {
                    // I've had this happen for _start, where there is a cached CU for the object but _start is outside
                    // of the CU's PC range
                    // ASSERT(cu_cache.size() == 0, "Vec should be empty?");
                }
                return nullopt;
            }
        }